

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_status.cpp
# Opt level: O0

void __thiscall libtorrent::torrent_status::~torrent_status(torrent_status *this)

{
  torrent_status *this_local;
  
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  ~typed_bitfield(&this->verified_pieces);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  ~typed_bitfield(&this->pieces);
  ::std::__cxx11::string::~string((string *)&this->current_tracker);
  ::std::weak_ptr<const_libtorrent::torrent_info>::~weak_ptr(&this->torrent_file);
  ::std::__cxx11::string::~string((string *)&this->name);
  ::std::__cxx11::string::~string((string *)&this->save_path);
  torrent_handle::~torrent_handle(&this->handle);
  return;
}

Assistant:

torrent_status::~torrent_status() = default;